

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void signed_long(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  Assert local_1c0 [2];
  outputter<long> local_1a0;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  long local_10;
  long i;
  
  local_10 = 0x2bcdef12;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = UnitTests::stream_any<long>(&local_10);
  UnitTests::stream_any_details::operator<<(local_188,&local_1a0);
  UnitTests::Assert::Assert
            (local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x4b);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[10],std::__cxx11::string>
            (local_1c0,(char (*) [10])"734916370",local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(signed_long)
{
    auto i  = 0x2bcdef12L;
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(i);
    ASSERT_EQUALS("734916370", ss.str());
}